

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

int __thiscall QObject::startTimer(QObject *this,nanoseconds interval,TimerType timerType)

{
  QObjectData *pQVar1;
  QObject *pQVar2;
  QThread *pQVar3;
  TimerId TVar4;
  QThread *pQVar5;
  _func_int **pp_Var6;
  QList<Qt::TimerId> *this_00;
  long in_FS_OFFSET;
  TimerId local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  if (interval.__r < 0) {
    startTimer();
    interval.__r = 1000000;
  }
  pQVar2 = pQVar1[1].q_ptr;
  if (pQVar2[6]._vptr_QObject == (_func_int **)0x0) {
    startTimer();
  }
  else {
    pQVar3 = (QThread *)(this->d_ptr).d[1].q_ptr[5]._vptr_QObject;
    pQVar5 = QThread::currentThread();
    if (pQVar5 == pQVar3) {
      TVar4 = QAbstractEventDispatcher::registerTimer
                        ((QAbstractEventDispatcher *)pQVar2[6]._vptr_QObject,(Duration)interval.__r,
                         timerType,this);
      if (pQVar1[1]._vptr_QObjectData == (_func_int **)0x0) {
        pp_Var6 = (_func_int **)operator_new(0x80);
        *pp_Var6 = (_func_int *)0x0;
        pp_Var6[1] = (_func_int *)0x0;
        pp_Var6[2] = (_func_int *)0x0;
        pp_Var6[3] = (_func_int *)0x0;
        pp_Var6[4] = (_func_int *)0x0;
        pp_Var6[5] = (_func_int *)0x0;
        pp_Var6[6] = (_func_int *)0x0;
        pp_Var6[7] = (_func_int *)0x0;
        pp_Var6[8] = (_func_int *)0x0;
        pp_Var6[9] = (_func_int *)0x0;
        pp_Var6[10] = (_func_int *)0x0;
        pp_Var6[0xb] = (_func_int *)0x0;
        pp_Var6[0xc] = (_func_int *)0x0;
        pp_Var6[0xd] = (_func_int *)0x0;
        pp_Var6[0xe] = (_func_int *)0x0;
        pp_Var6[0xf] = (_func_int *)pQVar1;
        pQVar1[1]._vptr_QObjectData = pp_Var6;
      }
      this_00 = (QList<Qt::TimerId> *)(pQVar1[1]._vptr_QObjectData + 6);
      local_3c = TVar4;
      QtPrivate::QPodArrayOps<Qt::TimerId>::emplace<Qt::TimerId&>
                ((QPodArrayOps<Qt::TimerId> *)this_00,(qsizetype)pQVar1[1]._vptr_QObjectData[8],
                 &local_3c);
      QList<Qt::TimerId>::end(this_00);
      goto LAB_002b58ff;
    }
    startTimer();
  }
  TVar4 = Invalid;
LAB_002b58ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return TVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QObject::startTimer(std::chrono::nanoseconds interval, Qt::TimerType timerType)
{
    Q_D(QObject);

    using namespace std::chrono_literals;

    if (interval < 0ns) {
        qWarning("QObject::startTimer: negative intervals aren't allowed; the "
                 "interval will be set to 1ms.");
        interval = 1ms;
    }

    auto thisThreadData = d->threadData.loadRelaxed();
    if (Q_UNLIKELY(!thisThreadData->hasEventDispatcher())) {
        qWarning("QObject::startTimer: Timers can only be used with threads started with QThread");
        return 0;
    }
    if (Q_UNLIKELY(thread() != QThread::currentThread())) {
        qWarning("QObject::startTimer: Timers cannot be started from another thread");
        return 0;
    }

    auto dispatcher = thisThreadData->eventDispatcher.loadRelaxed();
    Qt::TimerId timerId = dispatcher->registerTimer(interval, timerType, this);
    d->ensureExtraData();
    d->extraData->runningTimers.append(timerId);
    return int(timerId);
}